

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O1

void iDynTree::assertSpatialMotionAreEqual
               (SpatialMotionVector *f1,SpatialMotionVector *f2,double tol,string *file,int line)

{
  pointer pcVar1;
  Vector6 ret_1;
  Vector6 ret;
  string local_a8;
  VectorFixSize<6U> local_88;
  VectorFixSize<6U> local_58;
  
  local_58.m_data[0] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[0];
  local_58.m_data[1] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[1];
  local_58.m_data[2] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2];
  local_58.m_data[3] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0];
  local_58.m_data[4] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[1];
  local_58.m_data[5] =
       (f1->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[2];
  local_88.m_data[0] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[0];
  local_88.m_data[1] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[1];
  local_88.m_data[2] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2];
  local_88.m_data[3] =
       (f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0];
  local_88.m_data[4]._0_4_ =
       *(undefined4 *)
        ((f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data +
        1);
  local_88.m_data[4]._4_4_ =
       *(undefined4 *)
        ((long)(f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
               m_data + 0xc);
  local_88.m_data[5]._0_4_ =
       *(undefined4 *)
        ((f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data +
        2);
  local_88.m_data[5]._4_4_ =
       *(undefined4 *)
        ((long)(f2->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
               m_data + 0x14);
  pcVar1 = (file->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + file->_M_string_length);
  assertVectorAreEqual<iDynTree::VectorFixSize<6u>,iDynTree::VectorFixSize<6u>>
            (&local_58,&local_88,tol,&local_a8,line);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void assertSpatialMotionAreEqual(const SpatialMotionVector& f1, const SpatialMotionVector& f2, double tol, std::string file, int line)
{
    Vector6 f1plain = f1.asVector();
    Vector6 f2plain = f2.asVector();
    assertVectorAreEqual(f1plain,f2plain,tol,file,line);
}